

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

bool __thiscall
pbrt::TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::IsNonSpecular
          (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this)

{
  DielectricInterfaceBxDF *pDVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  
  pDVar1 = this->top;
  if (pDVar1 == (DielectricInterfaceBxDF *)0x0) {
    auVar2 = vminss_avx(ZEXT416((uint)(this->bottom->mfDistrib).alpha_y),
                        ZEXT416((uint)(this->bottom->mfDistrib).alpha_x));
    uVar3 = (uint)(auVar2._0_4_ < 0.001) * 8 + 9;
  }
  else {
    auVar2 = vminss_avx(ZEXT416((uint)(pDVar1->mfDistrib).alpha_y),
                        ZEXT416((uint)(pDVar1->mfDistrib).alpha_x));
    uVar3 = (uint)(auVar2._0_4_ < 0.001) * 8 + 0xb;
  }
  return SUB41((uVar3 & 8) >> 3,0);
}

Assistant:

PBRT_CPU_GPU
    bool IsNonSpecular() const {
        BxDFFlags flags = top ? top->Flags() : bottom->Flags();
        return (flags & (BxDFFlags::Diffuse | BxDFFlags::Glossy));
    }